

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# umutablecptrie.cpp
# Opt level: O3

uint32_t umutablecptrie_get_63(UMutableCPTrie *trie,UChar32 c)

{
  uint uVar1;
  UMutableCPTrie *pUVar2;
  
  if ((uint)c < 0x110000) {
    if (c < *(int *)(trie + 0x30)) {
      uVar1 = (uint)c >> 4;
      if (trie[(ulong)uVar1 + 0x40] == (UMutableCPTrie)0x0) {
        pUVar2 = (UMutableCPTrie *)((ulong)(uVar1 << 2) + *(long *)trie);
      }
      else {
        pUVar2 = (UMutableCPTrie *)
                 ((ulong)((c & 0xfU) + *(int *)(*(long *)trie + (ulong)uVar1 * 4)) * 4 +
                 *(long *)(trie + 0x10));
      }
    }
    else {
      pUVar2 = trie + 0x34;
    }
  }
  else {
    pUVar2 = trie + 0x2c;
  }
  return *(uint32_t *)pUVar2;
}

Assistant:

uint32_t MutableCodePointTrie::get(UChar32 c) const {
    if ((uint32_t)c > MAX_UNICODE) {
        return errorValue;
    }
    if (c >= highStart) {
        return highValue;
    }
    int32_t i = c >> UCPTRIE_SHIFT_3;
    if (flags[i] == ALL_SAME) {
        return index[i];
    } else {
        return data[index[i] + (c & UCPTRIE_SMALL_DATA_MASK)];
    }
}